

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_asm_impl.h
# Opt level: O0

void secp256k1_fe_mul_inner(uint64_t *r,uint64_t *a,uint64_t *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  uint64_t tmp3;
  uint64_t tmp2;
  uint64_t tmp1;
  uint64_t *b_local;
  uint64_t *a_local;
  uint64_t *r_local;
  
  uVar70 = *a;
  uVar72 = a[1];
  uVar1 = a[2];
  uVar2 = a[3];
  uVar3 = a[4];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *b;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar2;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = b[1];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = b[2];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar72;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = b[3];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar70;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = b[4];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar3;
  uVar67 = SUB168(auVar8 * auVar38,0);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar67 & 0xfffffffffffff;
  auVar4 = auVar5 * auVar35 + auVar4 * auVar34 + auVar6 * auVar36 + auVar7 * auVar37 +
           auVar9 * ZEXT816(0x1000003d10);
  uVar68 = auVar4._0_8_;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar68 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *b;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar3;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = b[1];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = b[2];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar1;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = b[3];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar72;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = b[4];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar70;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar67 >> 0x34 | SUB168(auVar8 * auVar38,8) << 0xc;
  auVar4 = auVar10 * auVar39 + auVar60 + auVar11 * auVar40 + auVar12 * auVar41 + auVar13 * auVar42 +
           auVar14 * auVar43 + auVar15 * ZEXT816(0x1000003d10);
  uVar67 = auVar4._0_8_;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar67 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *b;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar70;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = b[1];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar3;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = b[2];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar2;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = b[3];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar1;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = b[4];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar72;
  auVar4 = auVar17 * auVar45 + auVar61 + auVar18 * auVar46 + auVar19 * auVar47 + auVar20 * auVar48;
  uVar69 = auVar4._0_8_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar69 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = (uVar69 & 0xfffffffffffff) << 4 | (uVar67 & 0xfffffffffffff) >> 0x30;
  auVar4 = auVar16 * auVar44 + ZEXT816(0x1000003d1) * auVar49;
  uVar69 = auVar4._0_8_;
  *r = uVar69 & 0xfffffffffffff;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar69 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *b;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar72;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = b[1];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar70;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = b[2];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar3;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = b[3];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar2;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = b[4];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar1;
  auVar5 = auVar23 * auVar52 + auVar63 + auVar24 * auVar53 + auVar25 * auVar54;
  uVar69 = auVar5._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar69 & 0xfffffffffffff;
  auVar4 = auVar21 * auVar50 + auVar62 + auVar22 * auVar51 + auVar26 * ZEXT816(0x1000003d10);
  uVar71 = auVar4._0_8_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar69 >> 0x34 | auVar5._8_8_ << 0xc;
  r[1] = uVar71 & 0xfffffffffffff;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar71 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *b;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar1;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = b[1];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar72;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = b[2];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar70;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = b[3];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar3;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = b[4];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar2;
  auVar5 = auVar30 * auVar58 + auVar65 + auVar31 * auVar59;
  uVar70 = auVar5._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar70 & 0xfffffffffffff;
  auVar4 = auVar27 * auVar55 + auVar64 + auVar28 * auVar56 + auVar29 * auVar57 +
           auVar32 * ZEXT816(0x1000003d10);
  uVar72 = auVar4._0_8_;
  r[2] = uVar72 & 0xfffffffffffff;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = (uVar72 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar68 & 0xfffffffffffff);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar70 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar66 = auVar33 * ZEXT816(0x1000003d10) + auVar66;
  uVar70 = auVar66._0_8_;
  r[3] = uVar70 & 0xfffffffffffff;
  r[4] = (uVar70 >> 0x34 | auVar66._8_8_ << 0xc) + (uVar67 & 0xffffffffffff);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_mul_inner(uint64_t *r, const uint64_t *a, const uint64_t * SECP256K1_RESTRICT b) {
/**
 * Registers: rdx:rax = multiplication accumulator
 *            r9:r8   = c
 *            r15:rcx = d
 *            r10-r14 = a0-a4
 *            rbx     = b
 *            rdi     = r
 *            rsi     = a / t?
 */
  uint64_t tmp1, tmp2, tmp3;
__asm__ __volatile__(
    "movq 0(%%rsi),%%r10\n"
    "movq 8(%%rsi),%%r11\n"
    "movq 16(%%rsi),%%r12\n"
    "movq 24(%%rsi),%%r13\n"
    "movq 32(%%rsi),%%r14\n"

    /* d += a3 * b0 */
    "movq 0(%%rbx),%%rax\n"
    "mulq %%r13\n"
    "movq %%rax,%%rcx\n"
    "movq %%rdx,%%r15\n"
    /* d += a2 * b1 */
    "movq 8(%%rbx),%%rax\n"
    "mulq %%r12\n"
    "addq %%rax,%%rcx\n"
    "adcq %%rdx,%%r15\n"
    /* d += a1 * b2 */
    "movq 16(%%rbx),%%rax\n"
    "mulq %%r11\n"
    "addq %%rax,%%rcx\n"
    "adcq %%rdx,%%r15\n"
    /* d = a0 * b3 */
    "movq 24(%%rbx),%%rax\n"
    "mulq %%r10\n"
    "addq %%rax,%%rcx\n"
    "adcq %%rdx,%%r15\n"
    /* c = a4 * b4 */
    "movq 32(%%rbx),%%rax\n"
    "mulq %%r14\n"
    "movq %%rax,%%r8\n"
    "movq %%rdx,%%r9\n"
    /* d += (c & M) * R */
    "movq $0xfffffffffffff,%%rdx\n"
    "andq %%rdx,%%rax\n"
    "movq $0x1000003d10,%%rdx\n"
    "mulq %%rdx\n"
    "addq %%rax,%%rcx\n"
    "adcq %%rdx,%%r15\n"
    /* c >>= 52 (%%r8 only) */
    "shrdq $52,%%r9,%%r8\n"
    /* t3 (tmp1) = d & M */
    "movq %%rcx,%%rsi\n"
    "movq $0xfffffffffffff,%%rdx\n"
    "andq %%rdx,%%rsi\n"
    "movq %%rsi,%q1\n"
    /* d >>= 52 */
    "shrdq $52,%%r15,%%rcx\n"
    "xorq %%r15,%%r15\n"
    /* d += a4 * b0 */
    "movq 0(%%rbx),%%rax\n"
    "mulq %%r14\n"
    "addq %%rax,%%rcx\n"
    "adcq %%rdx,%%r15\n"
    /* d += a3 * b1 */
    "movq 8(%%rbx),%%rax\n"
    "mulq %%r13\n"
    "addq %%rax,%%rcx\n"
    "adcq %%rdx,%%r15\n"
    /* d += a2 * b2 */
    "movq 16(%%rbx),%%rax\n"
    "mulq %%r12\n"
    "addq %%rax,%%rcx\n"
    "adcq %%rdx,%%r15\n"
    /* d += a1 * b3 */
    "movq 24(%%rbx),%%rax\n"
    "mulq %%r11\n"
    "addq %%rax,%%rcx\n"
    "adcq %%rdx,%%r15\n"
    /* d += a0 * b4 */
    "movq 32(%%rbx),%%rax\n"
    "mulq %%r10\n"
    "addq %%rax,%%rcx\n"
    "adcq %%rdx,%%r15\n"
    /* d += c * R */
    "movq %%r8,%%rax\n"
    "movq $0x1000003d10,%%rdx\n"
    "mulq %%rdx\n"
    "addq %%rax,%%rcx\n"
    "adcq %%rdx,%%r15\n"
    /* t4 = d & M (%%rsi) */
    "movq %%rcx,%%rsi\n"
    "movq $0xfffffffffffff,%%rdx\n"
    "andq %%rdx,%%rsi\n"
    /* d >>= 52 */
    "shrdq $52,%%r15,%%rcx\n"
    "xorq %%r15,%%r15\n"
    /* tx = t4 >> 48 (tmp3) */
    "movq %%rsi,%%rax\n"
    "shrq $48,%%rax\n"
    "movq %%rax,%q3\n"
    /* t4 &= (M >> 4) (tmp2) */
    "movq $0xffffffffffff,%%rax\n"
    "andq %%rax,%%rsi\n"
    "movq %%rsi,%q2\n"
    /* c = a0 * b0 */
    "movq 0(%%rbx),%%rax\n"
    "mulq %%r10\n"
    "movq %%rax,%%r8\n"
    "movq %%rdx,%%r9\n"
    /* d += a4 * b1 */
    "movq 8(%%rbx),%%rax\n"
    "mulq %%r14\n"
    "addq %%rax,%%rcx\n"
    "adcq %%rdx,%%r15\n"
    /* d += a3 * b2 */
    "movq 16(%%rbx),%%rax\n"
    "mulq %%r13\n"
    "addq %%rax,%%rcx\n"
    "adcq %%rdx,%%r15\n"
    /* d += a2 * b3 */
    "movq 24(%%rbx),%%rax\n"
    "mulq %%r12\n"
    "addq %%rax,%%rcx\n"
    "adcq %%rdx,%%r15\n"
    /* d += a1 * b4 */
    "movq 32(%%rbx),%%rax\n"
    "mulq %%r11\n"
    "addq %%rax,%%rcx\n"
    "adcq %%rdx,%%r15\n"
    /* u0 = d & M (%%rsi) */
    "movq %%rcx,%%rsi\n"
    "movq $0xfffffffffffff,%%rdx\n"
    "andq %%rdx,%%rsi\n"
    /* d >>= 52 */
    "shrdq $52,%%r15,%%rcx\n"
    "xorq %%r15,%%r15\n"
    /* u0 = (u0 << 4) | tx (%%rsi) */
    "shlq $4,%%rsi\n"
    "movq %q3,%%rax\n"
    "orq %%rax,%%rsi\n"
    /* c += u0 * (R >> 4) */
    "movq $0x1000003d1,%%rax\n"
    "mulq %%rsi\n"
    "addq %%rax,%%r8\n"
    "adcq %%rdx,%%r9\n"
    /* r[0] = c & M */
    "movq %%r8,%%rax\n"
    "movq $0xfffffffffffff,%%rdx\n"
    "andq %%rdx,%%rax\n"
    "movq %%rax,0(%%rdi)\n"
    /* c >>= 52 */
    "shrdq $52,%%r9,%%r8\n"
    "xorq %%r9,%%r9\n"
    /* c += a1 * b0 */
    "movq 0(%%rbx),%%rax\n"
    "mulq %%r11\n"
    "addq %%rax,%%r8\n"
    "adcq %%rdx,%%r9\n"
    /* c += a0 * b1 */
    "movq 8(%%rbx),%%rax\n"
    "mulq %%r10\n"
    "addq %%rax,%%r8\n"
    "adcq %%rdx,%%r9\n"
    /* d += a4 * b2 */
    "movq 16(%%rbx),%%rax\n"
    "mulq %%r14\n"
    "addq %%rax,%%rcx\n"
    "adcq %%rdx,%%r15\n"
    /* d += a3 * b3 */
    "movq 24(%%rbx),%%rax\n"
    "mulq %%r13\n"
    "addq %%rax,%%rcx\n"
    "adcq %%rdx,%%r15\n"
    /* d += a2 * b4 */
    "movq 32(%%rbx),%%rax\n"
    "mulq %%r12\n"
    "addq %%rax,%%rcx\n"
    "adcq %%rdx,%%r15\n"
    /* c += (d & M) * R */
    "movq %%rcx,%%rax\n"
    "movq $0xfffffffffffff,%%rdx\n"
    "andq %%rdx,%%rax\n"
    "movq $0x1000003d10,%%rdx\n"
    "mulq %%rdx\n"
    "addq %%rax,%%r8\n"
    "adcq %%rdx,%%r9\n"
    /* d >>= 52 */
    "shrdq $52,%%r15,%%rcx\n"
    "xorq %%r15,%%r15\n"
    /* r[1] = c & M */
    "movq %%r8,%%rax\n"
    "movq $0xfffffffffffff,%%rdx\n"
    "andq %%rdx,%%rax\n"
    "movq %%rax,8(%%rdi)\n"
    /* c >>= 52 */
    "shrdq $52,%%r9,%%r8\n"
    "xorq %%r9,%%r9\n"
    /* c += a2 * b0 */
    "movq 0(%%rbx),%%rax\n"
    "mulq %%r12\n"
    "addq %%rax,%%r8\n"
    "adcq %%rdx,%%r9\n"
    /* c += a1 * b1 */
    "movq 8(%%rbx),%%rax\n"
    "mulq %%r11\n"
    "addq %%rax,%%r8\n"
    "adcq %%rdx,%%r9\n"
    /* c += a0 * b2 (last use of %%r10 = a0) */
    "movq 16(%%rbx),%%rax\n"
    "mulq %%r10\n"
    "addq %%rax,%%r8\n"
    "adcq %%rdx,%%r9\n"
    /* fetch t3 (%%r10, overwrites a0), t4 (%%rsi) */
    "movq %q2,%%rsi\n"
    "movq %q1,%%r10\n"
    /* d += a4 * b3 */
    "movq 24(%%rbx),%%rax\n"
    "mulq %%r14\n"
    "addq %%rax,%%rcx\n"
    "adcq %%rdx,%%r15\n"
    /* d += a3 * b4 */
    "movq 32(%%rbx),%%rax\n"
    "mulq %%r13\n"
    "addq %%rax,%%rcx\n"
    "adcq %%rdx,%%r15\n"
    /* c += (d & M) * R */
    "movq %%rcx,%%rax\n"
    "movq $0xfffffffffffff,%%rdx\n"
    "andq %%rdx,%%rax\n"
    "movq $0x1000003d10,%%rdx\n"
    "mulq %%rdx\n"
    "addq %%rax,%%r8\n"
    "adcq %%rdx,%%r9\n"
    /* d >>= 52 (%%rcx only) */
    "shrdq $52,%%r15,%%rcx\n"
    /* r[2] = c & M */
    "movq %%r8,%%rax\n"
    "movq $0xfffffffffffff,%%rdx\n"
    "andq %%rdx,%%rax\n"
    "movq %%rax,16(%%rdi)\n"
    /* c >>= 52 */
    "shrdq $52,%%r9,%%r8\n"
    "xorq %%r9,%%r9\n"
    /* c += t3 */
    "addq %%r10,%%r8\n"
    /* c += d * R */
    "movq %%rcx,%%rax\n"
    "movq $0x1000003d10,%%rdx\n"
    "mulq %%rdx\n"
    "addq %%rax,%%r8\n"
    "adcq %%rdx,%%r9\n"
    /* r[3] = c & M */
    "movq %%r8,%%rax\n"
    "movq $0xfffffffffffff,%%rdx\n"
    "andq %%rdx,%%rax\n"
    "movq %%rax,24(%%rdi)\n"
    /* c >>= 52 (%%r8 only) */
    "shrdq $52,%%r9,%%r8\n"
    /* c += t4 (%%r8 only) */
    "addq %%rsi,%%r8\n"
    /* r[4] = c */
    "movq %%r8,32(%%rdi)\n"
: "+S"(a), "=&m"(tmp1), "=&m"(tmp2), "=&m"(tmp3)
: "b"(b), "D"(r)
: "%rax", "%rcx", "%rdx", "%r8", "%r9", "%r10", "%r11", "%r12", "%r13", "%r14", "%r15", "cc", "memory"
);
}